

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::ToPropertyDescriptorForProxyObjects
               (Var propertySpec,PropertyDescriptor *descriptor,ScriptContext *scriptContext)

{
  code *pcVar1;
  Type TVar2;
  BOOL BVar3;
  Type TVar4;
  RecyclableObject *pRVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  PropertyRecord *pPVar7;
  Type *pTVar8;
  bool bVar9;
  Type local_38;
  Var value;
  
  BVar3 = IsObject(propertySpec);
  if (BVar3 == 0) {
    return 0;
  }
  pRVar5 = VarTo<Js::RecyclableObject>(propertySpec);
  BVar3 = HasProperty(pRVar5,0x194);
  if (BVar3 == 1) {
    bVar9 = false;
    BVar3 = GetProperty_Internal<false>
                      (pRVar5,pRVar5,false,0x194,&local_38.ptr,scriptContext,
                       (PropertyValueInfo *)0x0);
    if (BVar3 != 0) {
      BVar3 = JavascriptConversion::ToBoolean(local_38.ptr,scriptContext);
      bVar9 = BVar3 != 0;
    }
    PropertyDescriptor::SetEnumerable(descriptor,bVar9);
  }
  BVar3 = HasProperty(pRVar5,0x195);
  if (BVar3 == 1) {
    bVar9 = false;
    BVar3 = GetProperty_Internal<false>
                      (pRVar5,pRVar5,false,0x195,&local_38.ptr,scriptContext,
                       (PropertyValueInfo *)0x0);
    if (BVar3 != 0) {
      BVar3 = JavascriptConversion::ToBoolean(local_38.ptr,scriptContext);
      bVar9 = BVar3 != 0;
    }
    PropertyDescriptor::SetConfigurable(descriptor,bVar9);
  }
  BVar3 = HasProperty(pRVar5,0x197);
  if (BVar3 == 1) {
    pTVar8 = &local_38;
    BVar3 = GetProperty_Internal<false>
                      (pRVar5,pRVar5,false,0x197,&pTVar8->ptr,scriptContext,(PropertyValueInfo *)0x0
                      );
    if (BVar3 == 0) {
      pTVar8 = &(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue;
    }
    PropertyDescriptor::SetValue(descriptor,pTVar8->ptr);
  }
  BVar3 = HasProperty(pRVar5,0x196);
  if (BVar3 == 1) {
    bVar9 = false;
    BVar3 = GetProperty_Internal<false>
                      (pRVar5,pRVar5,false,0x196,&local_38.ptr,scriptContext,
                       (PropertyValueInfo *)0x0);
    if (BVar3 != 0) {
      BVar3 = JavascriptConversion::ToBoolean(local_38.ptr,scriptContext);
      bVar9 = BVar3 != 0;
    }
    PropertyDescriptor::SetWritable(descriptor,bVar9);
  }
  BVar3 = HasProperty(pRVar5,0x198);
  if (BVar3 == 1) {
    BVar3 = GetProperty_Internal<false>
                      (pRVar5,pRVar5,false,0x198,&local_38.ptr,scriptContext,
                       (PropertyValueInfo *)0x0);
    TVar2.ptr = local_38.ptr;
    if (BVar3 == 0) {
      pTVar8 = &(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue;
    }
    else {
      if (local_38.ptr == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar9) goto LAB_00acaa42;
        *puVar6 = 0;
      }
      if (((ulong)TVar2.ptr & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)TVar2.ptr & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar9) goto LAB_00acaa42;
        *puVar6 = 0;
      }
      if ((ulong)TVar2.ptr >> 0x32 == 0 &&
          ((ulong)TVar2.ptr & 0xffff000000000000) != 0x1000000000000) {
        this = UnsafeVarTo<Js::RecyclableObject>(TVar2.ptr);
        if (this == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar9) goto LAB_00acaa42;
          *puVar6 = 0;
        }
        TVar4 = ((this->type).ptr)->typeId;
        if (0x57 < (int)TVar4) {
          BVar3 = RecyclableObject::IsExternal(this);
          if (BVar3 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar9) goto LAB_00acaa42;
            *puVar6 = 0;
          }
          TVar4 = TypeIds_FirstNumberType;
        }
      }
      else {
        TVar4 = TypeIds_FirstNumberType;
      }
      pTVar8 = &local_38;
      if ((TVar4 != TypeIds_Undefined) &&
         (bVar9 = JavascriptConversion::IsCallable(local_38.ptr), !bVar9)) {
        pPVar7 = ScriptContext::GetPropertyName(scriptContext,0x198);
        goto LAB_00acaa0d;
      }
    }
    PropertyDescriptor::SetGetter(descriptor,pTVar8->ptr);
  }
  BVar3 = HasProperty(pRVar5,0x19b);
  if (BVar3 != 1) {
    return 1;
  }
  pTVar8 = &local_38;
  BVar3 = GetProperty_Internal<false>
                    (pRVar5,pRVar5,false,0x19b,&pTVar8->ptr,scriptContext,(PropertyValueInfo *)0x0);
  TVar2.ptr = local_38.ptr;
  if (BVar3 == 0) {
    pTVar8 = &(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue;
    goto LAB_00acaa21;
  }
  if (local_38.ptr == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar9) goto LAB_00acaa42;
    *puVar6 = 0;
  }
  if (((ulong)TVar2.ptr & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)TVar2.ptr & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar9) goto LAB_00acaa42;
    *puVar6 = 0;
  }
  if ((ulong)TVar2.ptr >> 0x32 == 0 && ((ulong)TVar2.ptr & 0xffff000000000000) != 0x1000000000000) {
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(TVar2.ptr);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar9) goto LAB_00acaa42;
      *puVar6 = 0;
    }
    TVar4 = ((pRVar5->type).ptr)->typeId;
    if (0x57 < (int)TVar4) {
      BVar3 = RecyclableObject::IsExternal(pRVar5);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar9) {
LAB_00acaa42:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      goto LAB_00aca9df;
    }
  }
  else {
LAB_00aca9df:
    TVar4 = TypeIds_FirstNumberType;
  }
  if ((TVar4 != TypeIds_Undefined) &&
     (bVar9 = JavascriptConversion::IsCallable(local_38.ptr), !bVar9)) {
    pPVar7 = ScriptContext::GetPropertyName(scriptContext,0x19b);
LAB_00acaa0d:
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec45,(PCWSTR)(pPVar7 + 1));
  }
LAB_00acaa21:
  PropertyDescriptor::SetSetter(descriptor,pTVar8->ptr);
  return 1;
}

Assistant:

BOOL JavascriptOperators::ToPropertyDescriptorForProxyObjects(Var propertySpec, PropertyDescriptor* descriptor, ScriptContext* scriptContext)
    {
        if (!JavascriptOperators::IsObject(propertySpec))
        {
            return FALSE;
        }

        Var value;
        RecyclableObject* propertySpecObj = VarTo<RecyclableObject>(propertySpec);

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::enumerable) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::enumerable, &value, scriptContext))
            {
                descriptor->SetEnumerable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetEnumerable(false);
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::configurable) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::configurable, &value, scriptContext))
            {
                descriptor->SetConfigurable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetConfigurable(false);
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::value) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::value, &value, scriptContext))
            {
                descriptor->SetValue(value);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetValue(scriptContext->GetLibrary()->GetUndefined());
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::writable) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::writable, &value, scriptContext))
            {
                descriptor->SetWritable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetWritable(false);
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::get) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::get, &value, scriptContext))
            {
                if (JavascriptOperators::GetTypeId(value) != TypeIds_Undefined && (false == JavascriptConversion::IsCallable(value)))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::get)->GetBuffer());
                }
                descriptor->SetGetter(value);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetGetter(scriptContext->GetLibrary()->GetUndefined());
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::set) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::set, &value, scriptContext))
            {
                if (JavascriptOperators::GetTypeId(value) != TypeIds_Undefined && (false == JavascriptConversion::IsCallable(value)))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::set)->GetBuffer());
                }
                descriptor->SetSetter(value);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetSetter(scriptContext->GetLibrary()->GetUndefined());
            }
        }

        return TRUE;
    }